

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

interval<unsigned_long> __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>::getBounds
          (NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
           *this,uint32_t size)

{
  unsigned_long uVar1;
  interval<unsigned_long> iVar2;
  interval<unsigned_long> *piVar3;
  unsigned_long *puVar4;
  uint in_ESI;
  BranchNode<unsigned_long,_8U,_false> *in_RDI;
  uint32_t i;
  BranchNode<unsigned_long,_8U,_false> *self;
  interval<unsigned_long> result;
  uint local_2c;
  unsigned_long local_8;
  
  piVar3 = BranchNode<unsigned_long,_8U,_false>::keyAt(in_RDI,0);
  uVar1 = piVar3->left;
  local_8 = piVar3->right;
  for (local_2c = 1; local_2c < in_ESI; local_2c = local_2c + 1) {
    piVar3 = BranchNode<unsigned_long,_8U,_false>::keyAt(in_RDI,local_2c);
    puVar4 = std::max<unsigned_long>(&local_8,&piVar3->right);
    local_8 = *puVar4;
  }
  iVar2.right = local_8;
  iVar2.left = uVar1;
  return iVar2;
}

Assistant:

interval<TKey> getBounds(uint32_t size) const {
        SLANG_ASSERT(size);
        auto& self = *static_cast<const TDerived*>(this);
        auto result = self.keyAt(0);
        for (uint32_t i = 1; i < size; i++)
            result.right = std::max(result.right, self.keyAt(i).right);
        return result;
    }